

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

bool __thiscall
miniros::NodeHandle::getParamNames
          (NodeHandle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  bool bVar1;
  _Alloc_hider local_20;
  
  getMasterLink((NodeHandle *)&stack0xffffffffffffffe0);
  bVar1 = MasterLink::getParamNames((MasterLink *)local_20._M_p,keys);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return bVar1;
}

Assistant:

bool NodeHandle::getParamNames(std::vector<std::string>& keys) const
{
  return getMasterLink()->getParamNames(keys);
}